

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O1

void test_dt_NMTOKENS(void)

{
  char cVar1;
  XSValue *pXVar2;
  long lVar3;
  int iVar4;
  void *pvVar5;
  char *pcVar6;
  char *pcVar7;
  Status myStatus;
  char iv_3 [5];
  char iv_2 [5];
  char iv_1 [7];
  char v_3 [12];
  char v_1 [19];
  char v_2 [24];
  Status local_a4;
  StrX local_a0;
  char local_90 [8];
  char local_88 [8];
  char local_80 [8];
  char local_78 [16];
  char local_68 [32];
  char local_48 [24];
  
  builtin_strncpy(local_68,"name1 name2 name3 ",0x13);
  builtin_strncpy(local_48,"Zeerochert total number",0x18);
  builtin_strncpy(local_78,"007 009 123",0xc);
  builtin_strncpy(local_80,"#board",7);
  builtin_strncpy(local_88,"@com",5);
  builtin_strncpy(local_90,";abc",5);
  local_a4 = st_Init;
  local_a0.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_68,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_a0.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_68,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_a0.fUnicodeForm,dt_NMTOKENS,&local_a4,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_a0);
  if (cVar1 == '\0') {
    StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x169c,local_68,local_a0.fLocalForm,1);
    StrX::~StrX(&local_a0);
    errSeen = 1;
  }
  local_a4 = st_Init;
  local_a0.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_48,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_a0.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_48,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_a0.fUnicodeForm,dt_NMTOKENS,&local_a4,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_a0);
  if (cVar1 == '\0') {
    StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x169d,local_48,local_a0.fLocalForm,1);
    StrX::~StrX(&local_a0);
    errSeen = 1;
  }
  local_a4 = st_Init;
  local_a0.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_78,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_a0.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_78,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_a0.fUnicodeForm,dt_NMTOKENS,&local_a4,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_a0);
  if (cVar1 == '\0') {
    StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x169e,local_78,local_a0.fLocalForm,1);
    StrX::~StrX(&local_a0);
    errSeen = 1;
  }
  local_a4 = st_Init;
  local_a0.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_80,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_a0.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_80,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_a0.fUnicodeForm,dt_NMTOKENS,&local_a4,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_a0);
  if (cVar1 != '\0') {
    StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x16a1,local_80,local_a0.fLocalForm,0);
    StrX::~StrX(&local_a0);
    errSeen = 1;
  }
  local_a4 = st_Init;
  local_a0.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_88,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_a0.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_88,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_a0.fUnicodeForm,dt_NMTOKENS,&local_a4,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_a0);
  if (cVar1 != '\0') {
    StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x16a2,local_88,local_a0.fLocalForm,0);
    StrX::~StrX(&local_a0);
    errSeen = 1;
  }
  local_a4 = st_Init;
  local_a0.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_90,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_a0.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_90,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_a0.fUnicodeForm,dt_NMTOKENS,&local_a4,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_a0);
  if (cVar1 != '\0') {
    StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x16a3,local_90,local_a0.fLocalForm,0);
    StrX::~StrX(&local_a0);
    errSeen = 1;
  }
  iVar4 = 1;
  do {
    local_a4 = st_Init;
    local_a0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_68,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_a0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_68,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar2 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_a0.fUnicodeForm,dt_NMTOKENS,&local_a4,ver_10,iVar4 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_a0);
    if (pXVar2 == (XSValue *)0x0) {
      if (local_a4 != st_NoActVal) {
        StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
        pcVar6 = "st_UnknownType";
        if ((ulong)local_a4 < 0xb) {
          pcVar6 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_a4];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x16bd,local_68,local_a0.fLocalForm,"st_NoActVal",pcVar6);
        StrX::~StrX(&local_a0);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
      pvVar5 = (void *)0x16bd;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x16bd,local_68);
      StrX::~StrX(&local_a0);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar2);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar2,pvVar5);
    }
    local_a4 = st_Init;
    local_a0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_48,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_a0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_48,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar2 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_a0.fUnicodeForm,dt_NMTOKENS,&local_a4,ver_10,iVar4 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_a0);
    if (pXVar2 == (XSValue *)0x0) {
      if (local_a4 != st_NoActVal) {
        StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
        pcVar6 = "st_UnknownType";
        if ((ulong)local_a4 < 0xb) {
          pcVar6 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_a4];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x16be,local_48,local_a0.fLocalForm,"st_NoActVal",pcVar6);
        StrX::~StrX(&local_a0);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
      pvVar5 = (void *)0x16be;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x16be,local_48);
      StrX::~StrX(&local_a0);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar2);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar2,pvVar5);
    }
    local_a4 = st_Init;
    local_a0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_78,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_a0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_78,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar2 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_a0.fUnicodeForm,dt_NMTOKENS,&local_a4,ver_10,iVar4 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_a0);
    if (pXVar2 == (XSValue *)0x0) {
      if (local_a4 != st_NoActVal) {
        StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
        pcVar6 = "st_UnknownType";
        if ((ulong)local_a4 < 0xb) {
          pcVar6 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_a4];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x16bf,local_78,local_a0.fLocalForm,"st_NoActVal",pcVar6);
        StrX::~StrX(&local_a0);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
      pvVar5 = (void *)0x16bf;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x16bf,local_78);
      StrX::~StrX(&local_a0);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar2);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar2,pvVar5);
    }
    local_a4 = st_Init;
    local_a0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_80,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_a0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_80,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar2 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_a0.fUnicodeForm,dt_NMTOKENS,&local_a4,ver_10,iVar4 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_a0);
    if (pXVar2 == (XSValue *)0x0) {
      if ((uint)(iVar4 == 1) * 3 + st_NoActVal != local_a4) {
        StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
        pcVar6 = "st_NoActVal";
        if (iVar4 == 1) {
          pcVar6 = "st_FOCA0002";
        }
        pcVar7 = "st_UnknownType";
        if ((ulong)local_a4 < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_a4];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x16c3,local_80,local_a0.fLocalForm,pcVar6,pcVar7);
        StrX::~StrX(&local_a0);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
      pvVar5 = (void *)0x16c3;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x16c3,local_80);
      StrX::~StrX(&local_a0);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar2);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar2,pvVar5);
    }
    local_a4 = st_Init;
    local_a0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_88,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_a0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_88,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar2 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_a0.fUnicodeForm,dt_NMTOKENS,&local_a4,ver_10,iVar4 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_a0);
    if (pXVar2 == (XSValue *)0x0) {
      if ((uint)(iVar4 == 1) * 3 + st_NoActVal != local_a4) {
        StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
        pcVar6 = "st_NoActVal";
        if (iVar4 == 1) {
          pcVar6 = "st_FOCA0002";
        }
        pcVar7 = "st_UnknownType";
        if ((ulong)local_a4 < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_a4];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x16c5,local_88,local_a0.fLocalForm,pcVar6,pcVar7);
        StrX::~StrX(&local_a0);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
      pvVar5 = (void *)0x16c5;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x16c5,local_88);
      StrX::~StrX(&local_a0);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar2);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar2,pvVar5);
    }
    local_a4 = st_Init;
    local_a0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_90,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_a0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_90,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar2 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_a0.fUnicodeForm,dt_NMTOKENS,&local_a4,ver_10,iVar4 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_a0);
    if (pXVar2 == (XSValue *)0x0) {
      if ((uint)(iVar4 == 1) * 3 + st_NoActVal != local_a4) {
        StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
        pcVar6 = "st_NoActVal";
        if (iVar4 == 1) {
          pcVar6 = "st_FOCA0002";
        }
        pcVar7 = "st_UnknownType";
        if ((ulong)local_a4 < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_a4];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x16c7,local_90,local_a0.fLocalForm,pcVar6,pcVar7);
        StrX::~StrX(&local_a0);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
      pvVar5 = (void *)0x16c7;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x16c7,local_90);
      StrX::~StrX(&local_a0);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar2);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar2,pvVar5);
    }
    iVar4 = iVar4 + -1;
  } while (iVar4 == 0);
  iVar4 = 1;
  do {
    local_a4 = st_Init;
    local_a0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_68,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_a0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_68,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar3 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_a0.fUnicodeForm,dt_NMTOKENS,&local_a4,ver_10,iVar4 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_a0);
    if (lVar3 == 0) {
      if (local_a4 != st_NoCanRep) {
        StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
        pcVar6 = "st_UnknownType";
        if ((ulong)local_a4 < 0xb) {
          pcVar6 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_a4];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x16e4,local_68,local_a0.fLocalForm,"st_NoCanRep",pcVar6);
        StrX::~StrX(&local_a0);
        goto LAB_00135a87;
      }
    }
    else {
      StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x16e4,local_68);
      StrX::~StrX(&local_a0);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar3);
LAB_00135a87:
      errSeen = 1;
    }
    local_a4 = st_Init;
    local_a0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_48,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_a0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_48,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar3 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_a0.fUnicodeForm,dt_NMTOKENS,&local_a4,ver_10,iVar4 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_a0);
    if (lVar3 == 0) {
      if (local_a4 != st_NoCanRep) {
        StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
        pcVar6 = "st_UnknownType";
        if ((ulong)local_a4 < 0xb) {
          pcVar6 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_a4];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x16e5,local_48,local_a0.fLocalForm,"st_NoCanRep",pcVar6);
        StrX::~StrX(&local_a0);
        goto LAB_00135b94;
      }
    }
    else {
      StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x16e5,local_48);
      StrX::~StrX(&local_a0);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar3);
LAB_00135b94:
      errSeen = 1;
    }
    local_a4 = st_Init;
    local_a0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_78,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_a0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_78,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar3 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_a0.fUnicodeForm,dt_NMTOKENS,&local_a4,ver_10,iVar4 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_a0);
    if (lVar3 == 0) {
      if (local_a4 != st_NoCanRep) {
        StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
        pcVar6 = "st_UnknownType";
        if ((ulong)local_a4 < 0xb) {
          pcVar6 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_a4];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x16e6,local_78,local_a0.fLocalForm,"st_NoCanRep",pcVar6);
        StrX::~StrX(&local_a0);
        goto LAB_00135c9e;
      }
    }
    else {
      StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x16e6,local_78);
      StrX::~StrX(&local_a0);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar3);
LAB_00135c9e:
      errSeen = 1;
    }
    local_a4 = st_Init;
    local_a0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_80,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_a0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_80,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar3 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_a0.fUnicodeForm,dt_NMTOKENS,&local_a4,ver_10,iVar4 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_a0);
    if (lVar3 == 0) {
      if ((uint)(iVar4 == 1) * 4 + st_NoCanRep != local_a4) {
        StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
        pcVar6 = "st_NoCanRep";
        if (iVar4 == 1) {
          pcVar6 = "st_FOCA0002";
        }
        pcVar7 = "st_UnknownType";
        if ((ulong)local_a4 < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_a4];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x16ea,local_80,local_a0.fLocalForm,pcVar6,pcVar7);
        StrX::~StrX(&local_a0);
        goto LAB_00135dc4;
      }
    }
    else {
      StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x16ea,local_80);
      StrX::~StrX(&local_a0);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar3);
LAB_00135dc4:
      errSeen = 1;
    }
    local_a4 = st_Init;
    local_a0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_88,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_a0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_88,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar3 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_a0.fUnicodeForm,dt_NMTOKENS,&local_a4,ver_10,iVar4 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_a0);
    if (lVar3 == 0) {
      if ((uint)(iVar4 == 1) * 4 + st_NoCanRep != local_a4) {
        StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
        pcVar6 = "st_NoCanRep";
        if (iVar4 == 1) {
          pcVar6 = "st_FOCA0002";
        }
        pcVar7 = "st_UnknownType";
        if ((ulong)local_a4 < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_a4];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x16ec,local_88,local_a0.fLocalForm,pcVar6,pcVar7);
        StrX::~StrX(&local_a0);
        goto LAB_00135eea;
      }
    }
    else {
      StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x16ec,local_88);
      StrX::~StrX(&local_a0);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar3);
LAB_00135eea:
      errSeen = 1;
    }
    local_a4 = st_Init;
    local_a0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_90,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_a0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_90,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar3 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_a0.fUnicodeForm,dt_NMTOKENS,&local_a4,ver_10,iVar4 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_a0);
    if (lVar3 == 0) {
      if ((uint)(iVar4 == 1) * 4 + st_NoCanRep != local_a4) {
        StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
        pcVar6 = "st_NoCanRep";
        if (iVar4 == 1) {
          pcVar6 = "st_FOCA0002";
        }
        pcVar7 = "st_UnknownType";
        if ((ulong)local_a4 < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_a4];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x16ee,local_90,local_a0.fLocalForm,pcVar6,pcVar7);
        StrX::~StrX(&local_a0);
        goto LAB_00136010;
      }
    }
    else {
      StrX::StrX(&local_a0,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x16ee,local_90);
      StrX::~StrX(&local_a0);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar3);
LAB_00136010:
      errSeen = 1;
    }
    iVar4 = iVar4 + -1;
    if (iVar4 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void test_dt_NMTOKENS()
{
    const XSValue::DataType dt = XSValue::dt_NMTOKENS;
    bool  toValidate = true;

    const char v_1[]="name1 name2 name3 ";
    const char v_2[]="Zeerochert total number";
    const char v_3[]="007 009 123";

    const char iv_1[]="#board";
    const char iv_2[]="@com";
    const char iv_3[]=";abc";

    XSValue::XSValue_Data act_v_ran_v_1;  act_v_ran_v_1.fValue.f_strVal = 0;
    XSValue::XSValue_Data act_v_ran_v_2;  act_v_ran_v_2.fValue.f_strVal = 0;
    XSValue::XSValue_Data act_v_ran_v_3;  act_v_ran_v_3.fValue.f_strVal = 0;

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *     valid                                       true              n/a
     *     invalid                      n/a            false             st_FOCA0002
     *
     ***/

    //  valid
    VALIDATE_TEST(v_1,   dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_2,   dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_3,   dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    //  invalid
    VALIDATE_TEST(iv_1,  dt, EXP_RET_VALID_FALSE,  DONT_CARE);
    VALIDATE_TEST(iv_2,  dt, EXP_RET_VALID_FALSE,  DONT_CARE);
    VALIDATE_TEST(iv_3,  dt, EXP_RET_VALID_FALSE,  DONT_CARE);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *   valid                                             0             st_NoActVal
     *   invalid                                           0             st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                             0             st_NoActVal
     *   invalid                                           0             st_NoActVal
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        //  valid
        ACTVALUE_TEST(v_1,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_1);
        ACTVALUE_TEST(v_2,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_2);
        ACTVALUE_TEST(v_3,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_3);

        //  invalid
        ACTVALUE_TEST(iv_1,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoActVal), act_v_ran_v_1);
        ACTVALUE_TEST(iv_2,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoActVal), act_v_ran_v_1);
        ACTVALUE_TEST(iv_3,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoActVal), act_v_ran_v_1);

    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *   valid                                            0              st_NoCanRep
     *   invalid                                          0              st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                            0              st_NoCanRep
     *   invalid                                          0              st_NoCanRep
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        //  valid
        CANREP_TEST(v_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);

        //  invalid
        CANREP_TEST(iv_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoCanRep));
        CANREP_TEST(iv_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoCanRep));
        CANREP_TEST(iv_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoCanRep));

    }

}